

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::MaybeLogToEmail(LogSeverity severity,char *message,size_t len)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  char *subject_00;
  char *body_00;
  string local_f8 [8];
  string body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string subject;
  string local_40 [8];
  string to;
  size_t len_local;
  char *message_local;
  LogSeverity severity_local;
  
  if ((email_logging_severity_ <= severity) || (fLI::FLAGS_logemaillevel <= severity)) {
    to.field_2._8_8_ = len;
    std::__cxx11::string::string(local_40,fLS::FLAGS_alsologtoemail_abi_cxx11_);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::operator+=(local_40,",");
      }
      std::__cxx11::string::operator+=(local_40,(string *)addresses__abi_cxx11_);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"[LOG] ",(allocator<char> *)(body.field_2._M_local_buf + 0xf));
    std::operator+(&local_b0,&local_d0,*(char **)(LogSeverityNames + (long)severity * 8));
    std::operator+(&local_90,&local_b0,": ");
    pcVar2 = glog_internal_namespace_::ProgramInvocationShortName();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_90,pcVar2);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(body.field_2._M_local_buf + 0xf));
    psVar3 = hostname_abi_cxx11_();
    std::__cxx11::string::string(local_f8,(string *)psVar3);
    std::__cxx11::string::operator+=(local_f8,"\n\n");
    std::__cxx11::string::append((char *)local_f8,(ulong)message);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    subject_00 = (char *)std::__cxx11::string::c_str();
    body_00 = (char *)std::__cxx11::string::c_str();
    SendEmailInternal(pcVar2,subject_00,body_00,false);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

inline void LogDestination::MaybeLogToEmail(LogSeverity severity,
					    const char* message, size_t len) {
  if (severity >= email_logging_severity_ ||
      severity >= FLAGS_logemaillevel) {
    string to(FLAGS_alsologtoemail);
    if (!addresses_.empty()) {
      if (!to.empty()) {
        to += ",";
      }
      to += addresses_;
    }
    const string subject(string("[LOG] ") + LogSeverityNames[severity] + ": " +
                         glog_internal_namespace_::ProgramInvocationShortName());
    string body(hostname());
    body += "\n\n";
    body.append(message, len);

    // should NOT use SendEmail().  The caller of this function holds the
    // log_mutex and SendEmail() calls LOG/VLOG which will block trying to
    // acquire the log_mutex object.  Use SendEmailInternal() and set
    // use_logging to false.
    SendEmailInternal(to.c_str(), subject.c_str(), body.c_str(), false);
  }
}